

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O1

void * ibuf_reserve(ibuf *buf,size_t len)

{
  size_t sVar1;
  int iVar2;
  
  if ((buf->size < buf->wpos + len) && (iVar2 = ibuf_realloc(buf,len), iVar2 == -1)) {
    return (void *)0x0;
  }
  sVar1 = buf->wpos;
  buf->wpos = len + sVar1;
  return buf->buf + sVar1;
}

Assistant:

void *
ibuf_reserve(struct ibuf *buf, size_t len)
{
	void	*b;

	if (buf->wpos + len > buf->size)
		if (ibuf_realloc(buf, len) == -1)
			return (NULL);

	b = buf->buf + buf->wpos;
	buf->wpos += len;
	return (b);
}